

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::sampleMaskToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *bitfield,int numBits)

{
  size_type __n;
  size_type sVar1;
  const_reference pvVar2;
  undefined1 *puVar3;
  int local_34;
  int targetCharNdx;
  int bit;
  int wordNdx;
  allocator<char> local_1e;
  undefined1 local_1d;
  int local_1c;
  _anonymous_namespace_ *p_Stack_18;
  int numBits_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *bitfield_local;
  string *result;
  
  local_1c = (int)bitfield;
  local_1d = 0;
  __n = (size_type)local_1c;
  p_Stack_18 = this;
  bitfield_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__n,'0',&local_1e);
  std::allocator<char>::~allocator(&local_1e);
  targetCharNdx = 0;
  do {
    sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)p_Stack_18);
    if ((int)sVar1 <= targetCharNdx) {
      return __return_storage_ptr__;
    }
    for (local_34 = 0; local_34 < 0x20; local_34 = local_34 + 1) {
      if ((local_1c - (targetCharNdx * 0x20 + local_34)) + -1 < 0) {
        return __return_storage_ptr__;
      }
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)p_Stack_18,
                          (long)targetCharNdx);
      if ((*pvVar2 >> ((byte)local_34 & 0x1f) & 1) != 0) {
        puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
        *puVar3 = 0x31;
      }
    }
    targetCharNdx = targetCharNdx + 1;
  } while( true );
}

Assistant:

static std::string sampleMaskToString (const std::vector<deUint32>& bitfield, int numBits)
{
	std::string result(numBits, '0');

	// move from back to front and set chars to 1
	for (int wordNdx = 0; wordNdx < (int)bitfield.size(); ++wordNdx)
	{
		for (int bit = 0; bit < 32; ++bit)
		{
			const int targetCharNdx = numBits - (wordNdx*32+bit) - 1;

			// beginning of the string reached
			if (targetCharNdx < 0)
				return result;

			if ((bitfield[wordNdx] >> bit) & 0x01)
				result[targetCharNdx] = '1';
		}
	}

	return result;
}